

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralCurveMemberVarying::IfcStructuralCurveMemberVarying
          (IfcStructuralCurveMemberVarying *this)

{
  *(undefined ***)&(this->super_IfcStructuralCurveMember).field_0x160 = &PTR__Object_008048a0;
  *(undefined8 *)&this->field_0x168 = 0;
  *(char **)&this->field_0x170 = "IfcStructuralCurveMemberVarying";
  IfcStructuralCurveMember::IfcStructuralCurveMember
            (&this->super_IfcStructuralCurveMember,&PTR_construction_vtable_24__008b7238);
  *(undefined8 *)
   &(this->super_IfcStructuralCurveMember).super_IfcStructuralMember.super_IfcStructuralItem.
    super_IfcProduct.super_IfcObject = 0x8b70e0;
  *(undefined8 *)&(this->super_IfcStructuralCurveMember).field_0x160 = 0x8b7220;
  *(undefined8 *)
   &(this->super_IfcStructuralCurveMember).super_IfcStructuralMember.super_IfcStructuralItem.
    super_IfcProduct.super_IfcObject.field_0x88 = 0x8b7108;
  (this->super_IfcStructuralCurveMember).super_IfcStructuralMember.super_IfcStructuralItem.
  super_IfcProduct.super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
  _vptr_ObjectHelper = (_func_int **)0x8b7130;
  *(undefined8 *)
   &(this->super_IfcStructuralCurveMember).super_IfcStructuralMember.super_IfcStructuralItem.
    super_IfcProduct.super_IfcObject.field_0xd0 = 0x8b7158;
  *(undefined8 *)
   &(this->super_IfcStructuralCurveMember).super_IfcStructuralMember.super_IfcStructuralItem.
    super_IfcProduct.field_0x100 = 0x8b7180;
  *(undefined8 *)
   &(this->super_IfcStructuralCurveMember).super_IfcStructuralMember.super_IfcStructuralItem.
    super_IfcProduct.field_0x110 = 0x8b71a8;
  *(undefined8 *)
   &(this->super_IfcStructuralCurveMember).super_IfcStructuralMember.super_IfcStructuralItem.
    field_0x120 = 0x8b71d0;
  *(undefined8 *)&(this->super_IfcStructuralCurveMember).field_0x150 = 0x8b71f8;
  return;
}

Assistant:

IfcStructuralCurveMemberVarying() : Object("IfcStructuralCurveMemberVarying") {}